

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

parser_error parse_object_type(parser *p)

{
  object_base *poVar1;
  wchar_t wVar2;
  parser_error pVar3;
  void *pvVar4;
  char *name;
  int iVar5;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getsym(p,"tval");
    wVar2 = tval_find_idx(name);
    if (wVar2 < L'\0') {
      pVar3 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      *(wchar_t *)((long)pvVar4 + 0x24) = wVar2;
      poVar1 = kb_info;
      *(object_base **)((long)pvVar4 + 0x10) = kb_info + (uint)wVar2;
      iVar5 = poVar1[(uint)wVar2].num_svals + 1;
      poVar1[(uint)wVar2].num_svals = iVar5;
      *(int *)((long)pvVar4 + 0x28) = iVar5;
      pVar3 = PARSE_ERROR_NONE;
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_object_type(struct parser *p) {
	struct object_kind *k = parser_priv(p);
	int tval;

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	k->tval = tval;
	k->base = &kb_info[k->tval];
	k->base->num_svals++;
	k->sval = k->base->num_svals;
	return PARSE_ERROR_NONE;
}